

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O0

int __thiscall MeCab::POSIDGenerator::id(POSIDGenerator *this,char *feature)

{
  undefined1 uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  string *psVar5;
  string *psVar6;
  ostream *poVar7;
  char **input;
  char *in_RSI;
  string tmp;
  size_t n;
  scoped_fixed_array<char_*,_8192> col;
  scoped_fixed_array<char,_8192> buf;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  ostream *in_stack_fffffffffffffea0;
  ostream *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  char **in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  string local_88 [38];
  byte local_62;
  die local_61;
  string *local_60;
  byte local_56;
  die local_55 [13];
  scoped_fixed_array<char_*,_8192> local_48;
  scoped_fixed_array<char,_8192> local_30;
  char *local_18;
  int local_4;
  
  local_18 = in_RSI;
  scoped_fixed_array<char,_8192>::scoped_fixed_array
            ((scoped_fixed_array<char,_8192> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  scoped_fixed_array<char_*,_8192>::scoped_fixed_array
            ((scoped_fixed_array<char_*,_8192> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  sVar2 = strlen(local_18);
  local_56 = 0;
  sVar3 = scoped_fixed_array<char,_8192>::size(&local_30);
  if (sVar3 - 1 <= sVar2) {
    die::die(local_55);
    local_56 = 1;
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xe8);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"std::strlen(feature) < buf.size() - 1");
    poVar7 = std::operator<<(poVar7,"] ");
    poVar7 = std::operator<<(poVar7,"too long feature");
    die::operator&(local_55,poVar7);
  }
  if ((local_56 & 1) != 0) {
    die::~die((die *)0x14376d);
  }
  pcVar4 = scoped_fixed_array<char,_8192>::get(&local_30);
  sVar3 = scoped_fixed_array<char,_8192>::size(&local_30);
  strncpy(pcVar4,local_18,sVar3 - 1);
  scoped_fixed_array<char,_8192>::get(&local_30);
  scoped_fixed_array<char_*,_8192>::get(&local_48);
  scoped_fixed_array<char_*,_8192>::size(&local_48);
  psVar5 = (string *)
           tokenizeCSV<char**>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                               in_stack_fffffffffffffeb0);
  local_62 = 0;
  local_60 = psVar5;
  psVar6 = (string *)scoped_fixed_array<char_*,_8192>::size(&local_48);
  if (psVar6 <= psVar5) {
    die::die(&local_61);
    local_62 = 1;
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xeb);
    poVar7 = std::operator<<(poVar7,") [");
    poVar7 = std::operator<<(poVar7,"n < col.size()");
    in_stack_fffffffffffffea8 = std::operator<<(poVar7,"] ");
    in_stack_fffffffffffffea0 = std::operator<<(in_stack_fffffffffffffea8,"too long CSV entities");
    die::operator&(&local_61,in_stack_fffffffffffffea0);
  }
  if ((local_62 & 1) != 0) {
    die::~die((die *)0x143966);
  }
  std::__cxx11::string::string(local_88);
  psVar5 = local_60;
  input = scoped_fixed_array<char_*,_8192>::get(&local_48);
  uVar1 = RewriteRules::rewrite
                    ((RewriteRules *)in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0,
                     input,psVar5);
  if ((bool)uVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_4 = atoi(pcVar4);
  }
  else {
    local_4 = -1;
  }
  std::__cxx11::string::~string(local_88);
  scoped_fixed_array<char_*,_8192>::~scoped_fixed_array
            ((scoped_fixed_array<char_*,_8192> *)CONCAT17(uVar1,in_stack_fffffffffffffe80));
  scoped_fixed_array<char,_8192>::~scoped_fixed_array
            ((scoped_fixed_array<char,_8192> *)CONCAT17(uVar1,in_stack_fffffffffffffe80));
  return local_4;
}

Assistant:

int POSIDGenerator::id(const char *feature) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, BUF_SIZE> col;
  CHECK_DIE(std::strlen(feature) < buf.size() - 1) << "too long feature";
  std::strncpy(buf.get(), feature, buf.size() - 1);
  const size_t n = tokenizeCSV(buf.get(), col.get(), col.size());
  CHECK_DIE(n < col.size()) << "too long CSV entities";
  std::string tmp;
  if (!rewrite_.rewrite(n, const_cast<const char **>(col.get()), &tmp)) {
    return -1;
  }
  return std::atoi(tmp.c_str());
}